

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

Curl_dns_entry * fetch_addr(Curl_easy *data,char *hostname,int port)

{
  uchar uVar1;
  int iVar2;
  size_t sVar3;
  Curl_dns_entry *pCVar4;
  time_t tVar5;
  Curl_addrinfo *pCVar6;
  curl_trc_feat *pcVar7;
  uint uVar8;
  ulong uVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar10;
  long extraout_RDX_01;
  char *fmt;
  size_t in_R8;
  Curl_dns_entry *dns;
  char entry_id [262];
  char cStack_128;
  char local_127 [263];
  
  sVar3 = create_hostcache_id(hostname,0,port,&cStack_128,in_R8);
  pCVar4 = (Curl_dns_entry *)Curl_hash_pick((data->dns).hostcache,&cStack_128,sVar3 + 1);
  lVar10 = extraout_RDX;
  if (pCVar4 == (Curl_dns_entry *)0x0) {
    if (((data->state).field_0x776 & 1) == 0) {
      return (Curl_dns_entry *)0x0;
    }
    Curl_strntolower(&cStack_128,"*",1);
    iVar2 = curl_msnprintf(local_127,7,":%u",(ulong)(uint)port);
    pCVar4 = (Curl_dns_entry *)Curl_hash_pick((data->dns).hostcache,&cStack_128,(long)iVar2 + 2);
    if (pCVar4 == (Curl_dns_entry *)0x0) {
      return (Curl_dns_entry *)0x0;
    }
    sVar3 = (long)iVar2 + 1;
    lVar10 = extraout_RDX_01;
  }
  if ((data->set).dns_cache_timeout == -1) {
LAB_0012fb96:
    uVar1 = data->conn->ip_version;
    if (uVar1 == '\0') {
      return pCVar4;
    }
    uVar9 = 0;
    lVar10 = CONCAT71((int7)((ulong)lVar10 >> 8),uVar1 == '\x02');
    pCVar6 = pCVar4->addr;
    if (pCVar6 != (Curl_addrinfo *)0x0) {
      uVar8 = (uint)(uVar1 == '\x02') * 8 + 2;
      uVar9 = (ulong)uVar8;
      do {
        if (pCVar6->ai_family == uVar8) {
          return pCVar4;
        }
        pCVar6 = pCVar6->ai_next;
      } while (pCVar6 != (Curl_addrinfo *)0x0);
      if (data == (Curl_easy *)0x0) goto LAB_0012fc03;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_0012fc03;
    pcVar7 = (data->state).feat;
    fmt = "Hostname in DNS cache does not have needed family, zapped";
  }
  else {
    tVar5 = time((time_t *)0x0);
    uVar9 = pCVar4->timestamp;
    lVar10 = extraout_RDX_00;
    if ((uVar9 == 0) ||
       (lVar10 = (long)(data->set).dns_cache_timeout, (long)(tVar5 - uVar9) < lVar10))
    goto LAB_0012fb96;
    if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_0012fc03;
    pcVar7 = (data->state).feat;
    fmt = "Hostname in DNS cache was stale, zapped";
  }
  if ((pcVar7 == (curl_trc_feat *)0x0) || (0 < pcVar7->log_level)) {
    Curl_infof(data,fmt,lVar10,uVar9);
  }
LAB_0012fc03:
  Curl_hash_delete((data->dns).hostcache,&cStack_128,sVar3 + 1);
  return (Curl_dns_entry *)0x0;
}

Assistant:

static struct Curl_dns_entry *fetch_addr(struct Curl_easy *data,
                                         const char *hostname,
                                         int port)
{
  struct Curl_dns_entry *dns = NULL;
  char entry_id[MAX_HOSTCACHE_LEN];

  /* Create an entry id, based upon the hostname and port */
  size_t entry_len = create_hostcache_id(hostname, 0, port,
                                         entry_id, sizeof(entry_id));

  /* See if it is already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

  /* No entry found in cache, check if we might have a wildcard entry */
  if(!dns && data->state.wildcard_resolve) {
    entry_len = create_hostcache_id("*", 1, port, entry_id, sizeof(entry_id));

    /* See if it is already in our dns cache */
    dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);
  }

  if(dns && (data->set.dns_cache_timeout != -1)) {
    /* See whether the returned entry is stale. Done before we release lock */
    struct hostcache_prune_data user;

    user.now = time(NULL);
    user.max_age_sec = data->set.dns_cache_timeout;
    user.oldest = 0;

    if(hostcache_entry_is_stale(&user, dns)) {
      infof(data, "Hostname in DNS cache was stale, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }

  /* See if the returned entry matches the required resolve mode */
  if(dns && data->conn->ip_version != CURL_IPRESOLVE_WHATEVER) {
    int pf = PF_INET;
    bool found = FALSE;
    struct Curl_addrinfo *addr = dns->addr;

#ifdef PF_INET6
    if(data->conn->ip_version == CURL_IPRESOLVE_V6)
      pf = PF_INET6;
#endif

    while(addr) {
      if(addr->ai_family == pf) {
        found = TRUE;
        break;
      }
      addr = addr->ai_next;
    }

    if(!found) {
      infof(data, "Hostname in DNS cache does not have needed family, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }
  return dns;
}